

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,Descriptor **args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3)

{
  Printer *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string *local_118;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f5 [13];
  string *local_e8;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  iterator local_60;
  size_type local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  Descriptor **args_local;
  char *format_local;
  Formatter *this_local;
  
  this_00 = this->printer_;
  local_e8 = &local_e0;
  local_38 = args_3;
  args_local_3 = args_2;
  args_local_2 = args_1;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (Descriptor **)format;
  format_local = (char *)this;
  ToString_abi_cxx11_(local_e8,(Formatter *)*args,(Descriptor *)args);
  local_e8 = &local_c0;
  ToString(local_e8,args_local_2);
  local_e8 = &local_a0;
  ToString(local_e8,args_local_3);
  local_e8 = &local_80;
  ToString(local_e8,local_38);
  local_60 = &local_e0;
  local_58 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_f5);
  __l._M_len = local_58;
  __l._M_array = local_60;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_50,__l,local_f5);
  io::Printer::FormatInternal(this_00,&local_50,&this->vars_,(char *)args_local);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_f5);
  local_118 = (string *)&local_60;
  do {
    local_118 = local_118 + -1;
    std::__cxx11::string::~string((string *)local_118);
  } while (local_118 != &local_e0);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }